

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_LookupNetwork_Test::PersistentStorageJsonTestSuite_LookupNetwork_Test
          (PersistentStorageJsonTestSuite_LookupNetwork_Test *this)

{
  PersistentStorageJsonTestSuite_LookupNetwork_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__PersistentStorageJsonTestSuite_LookupNetwork_Test_0047f558;
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, LookupNetwork)
{
    // Make test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    // Populate storage with initial data
    NetworkId newId;
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk1", 0xFFFFFFFFFFFFFFF1ll, 11, 0xFFF1, "2000:aaa1::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk2", 0xFFFFFFFFFFFFFFF2ll, 11, 0xFFF2, "2000:aaa2::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk3", 0xFFFFFFFFFFFFFFF3ll, 11, 0xFFF3, "2000:aaa3::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    // The test
    std::vector<Network> retLookup;

    EXPECT_TRUE(psj.Lookup(Network{}, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 3);

    retLookup.clear();

    Network net;
    net.mName = "nwk1";
    net.mCcm  = true;
    EXPECT_TRUE(psj.Lookup(net, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 1);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}